

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O1

int __thiscall
flow::BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1>::clone
          (BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  Value *lhs;
  Value *rhs;
  BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *this_00;
  
  lhs = (Value *)**(undefined8 **)(__fn + 0x50);
  rhs = (Value *)(*(undefined8 **)(__fn + 0x50))[1];
  this_00 = (BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)operator_new(0x70);
  BinaryInstr(this_00,lhs,rhs,(string *)(__fn + 0x10));
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> clone() override {
    return std::make_unique<BinaryInstr<Operator, ResultType>>(
        operand(0), operand(1), name());
  }